

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<toml::value_t,_toml::error_info> *
toml::detail::guess_value_type<toml::type_config>
          (result<toml::value_t,_toml::error_info> *__return_storage_ptr__,location *loc,
          context<toml::type_config> *ctx)

{
  byte bVar1;
  element_type *peVar2;
  long lVar3;
  undefined8 uVar4;
  _Alloc_hider _Var5;
  location inner;
  either local_828;
  undefined1 local_808 [32];
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_7e8;
  _Alloc_hider local_7d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7c0 [2];
  string local_7a0;
  string local_780;
  string local_760;
  string local_740;
  string local_720;
  string local_700;
  string local_6e0;
  string local_6c0;
  string local_6a0;
  string local_680;
  string local_660;
  string local_640;
  string local_620;
  string local_600;
  string local_5e0;
  string local_5c0;
  location local_5a0;
  literal local_558;
  literal local_540;
  location local_528;
  location local_4e0;
  location local_498;
  location local_450;
  location local_408;
  location local_3c0;
  location local_378;
  location local_330;
  failure<toml::error_info> local_2e8;
  failure<toml::error_info> local_290;
  failure<toml::error_info> local_238;
  failure<toml::error_info> local_1e0;
  failure<toml::error_info> local_188;
  failure<toml::error_info> local_130;
  failure<toml::error_info> local_d8;
  failure<toml::error_info> local_80;
  
  location::location(&local_5a0,loc);
  peVar2 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  lVar3 = (long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (loc->location_ <
      (ulong)((long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish - lVar3)) {
    bVar1 = *(byte *)(lVar3 + loc->location_);
    if (bVar1 < 0x5b) {
      if (bVar1 < 0x49) {
        if ((bVar1 == 0x22) || (bVar1 == 0x27)) {
          __return_storage_ptr__->is_ok_ = true;
          (__return_storage_ptr__->field_1).succ_.value = string;
          goto LAB_003aab64;
        }
        if (bVar1 != 0x46) goto LAB_003aab56;
        local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_600,
                   "toml::parse_value: `false` must be in lowercase. A string must be surrounded by quotes."
                   ,"");
        local_540.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005289f8;
        local_540.value_ = "true";
        local_540.size_ = 4;
        local_558.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005289f8;
        local_558.value_ = "false";
        local_558.size_ = 5;
        either::either<toml::detail::literal,toml::detail::literal>
                  (&local_828,&local_540,&local_558);
        location::location(&local_378,&local_5a0);
        local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_620,"");
        make_syntax_error<toml::detail::either>
                  ((error_info *)local_808,&local_600,&local_828,&local_378,&local_620);
        err<toml::error_info>(&local_d8,(error_info *)local_808);
        __return_storage_ptr__->is_ok_ = false;
        failure<toml::error_info>::failure
                  ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_d8);
        failure<toml::error_info>::~failure(&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7d0._M_p != local_7c0) {
          operator_delete(local_7d0._M_p,local_7c0[0]._M_allocated_capacity + 1);
        }
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_7e8);
        if ((undefined1 *)local_808._0_8_ != local_808 + 0x10) {
          operator_delete((void *)local_808._0_8_,local_808._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_620._M_dataplus._M_p != &local_620.field_2) {
          operator_delete(local_620._M_dataplus._M_p,local_620.field_2._M_allocated_capacity + 1);
        }
        location::~location(&local_378);
        std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
        ~vector(&local_828.others_);
        local_700.field_2._M_allocated_capacity = local_600.field_2._M_allocated_capacity;
        _Var5._M_p = local_600._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_600._M_dataplus._M_p == &local_600.field_2) goto LAB_003aab64;
      }
      else if (bVar1 == 0x49) {
        local_680._M_dataplus._M_p = (pointer)&local_680.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_680,
                   "toml::parse_value: `inf` must be in lowercase. A string must be surrounded by quotes."
                   ,"");
        syntax::floating(&local_828,&ctx->toml_spec_);
        location::location(&local_408,&local_5a0);
        local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"");
        make_syntax_error<toml::detail::either>
                  ((error_info *)local_808,&local_680,&local_828,&local_408,&local_6a0);
        err<toml::error_info>(&local_188,(error_info *)local_808);
        __return_storage_ptr__->is_ok_ = false;
        failure<toml::error_info>::failure
                  ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_188)
        ;
        failure<toml::error_info>::~failure(&local_188);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7d0._M_p != local_7c0) {
          operator_delete(local_7d0._M_p,local_7c0[0]._M_allocated_capacity + 1);
        }
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_7e8);
        if ((undefined1 *)local_808._0_8_ != local_808 + 0x10) {
          operator_delete((void *)local_808._0_8_,local_808._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
          operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
        }
        location::~location(&local_408);
        std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
        ~vector(&local_828.others_);
        local_700.field_2._M_allocated_capacity = local_680.field_2._M_allocated_capacity;
        _Var5._M_p = local_680._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_680._M_dataplus._M_p == &local_680.field_2) goto LAB_003aab64;
      }
      else if (bVar1 == 0x4e) {
        if ((ctx->toml_spec_).ext_null_value == true) {
          local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_740,
                     "toml::parse_value: Both `nan` and `null` must be in lowercase. A string must be surrounded by quotes."
                     ,"");
          syntax::floating(&local_828,&ctx->toml_spec_);
          location::location(&local_4e0,&local_5a0);
          local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_760,"");
          make_syntax_error<toml::detail::either>
                    ((error_info *)local_808,&local_740,&local_828,&local_4e0,&local_760);
          err<toml::error_info>(&local_290,(error_info *)local_808);
          __return_storage_ptr__->is_ok_ = false;
          failure<toml::error_info>::failure
                    ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                     &local_290);
          failure<toml::error_info>::~failure(&local_290);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7d0._M_p != local_7c0) {
            operator_delete(local_7d0._M_p,local_7c0[0]._M_allocated_capacity + 1);
          }
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&local_7e8);
          if ((undefined1 *)local_808._0_8_ != local_808 + 0x10) {
            operator_delete((void *)local_808._0_8_,local_808._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_760._M_dataplus._M_p != &local_760.field_2) {
            operator_delete(local_760._M_dataplus._M_p,local_760.field_2._M_allocated_capacity + 1);
          }
          location::~location(&local_4e0);
          std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ::~vector(&local_828.others_);
          local_700.field_2._M_allocated_capacity = local_740.field_2._M_allocated_capacity;
          _Var5._M_p = local_740._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_740._M_dataplus._M_p == &local_740.field_2) goto LAB_003aab64;
        }
        else {
          local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_780,
                     "toml::parse_value: `nan` must be in lowercase. A string must be surrounded by quotes."
                     ,"");
          syntax::floating(&local_828,&ctx->toml_spec_);
          location::location(&local_528,&local_5a0);
          local_7a0._M_dataplus._M_p = (pointer)&local_7a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a0,"");
          make_syntax_error<toml::detail::either>
                    ((error_info *)local_808,&local_780,&local_828,&local_528,&local_7a0);
          err<toml::error_info>(&local_2e8,(error_info *)local_808);
          __return_storage_ptr__->is_ok_ = false;
          failure<toml::error_info>::failure
                    ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                     &local_2e8);
          failure<toml::error_info>::~failure(&local_2e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7d0._M_p != local_7c0) {
            operator_delete(local_7d0._M_p,local_7c0[0]._M_allocated_capacity + 1);
          }
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&local_7e8);
          if ((undefined1 *)local_808._0_8_ != local_808 + 0x10) {
            operator_delete((void *)local_808._0_8_,local_808._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
            operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
          }
          location::~location(&local_528);
          std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ::~vector(&local_828.others_);
          local_700.field_2._M_allocated_capacity = local_780.field_2._M_allocated_capacity;
          _Var5._M_p = local_780._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_780._M_dataplus._M_p == &local_780.field_2) goto LAB_003aab64;
        }
      }
      else {
        if (bVar1 != 0x54) goto LAB_003aab56;
        local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_5c0,
                   "toml::parse_value: `true` must be in lowercase. A string must be surrounded by quotes."
                   ,"");
        local_540.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005289f8;
        local_540.value_ = "true";
        local_540.size_ = 4;
        local_558.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005289f8;
        local_558.value_ = "false";
        local_558.size_ = 5;
        either::either<toml::detail::literal,toml::detail::literal>
                  (&local_828,&local_540,&local_558);
        location::location(&local_330,&local_5a0);
        local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e0,"");
        make_syntax_error<toml::detail::either>
                  ((error_info *)local_808,&local_5c0,&local_828,&local_330,&local_5e0);
        err<toml::error_info>(&local_80,(error_info *)local_808);
        __return_storage_ptr__->is_ok_ = false;
        failure<toml::error_info>::failure
                  ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_80);
        failure<toml::error_info>::~failure(&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7d0._M_p != local_7c0) {
          operator_delete(local_7d0._M_p,local_7c0[0]._M_allocated_capacity + 1);
        }
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_7e8);
        if ((undefined1 *)local_808._0_8_ != local_808 + 0x10) {
          operator_delete((void *)local_808._0_8_,local_808._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
          operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
        }
        location::~location(&local_330);
        std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
        ~vector(&local_828.others_);
        local_700.field_2._M_allocated_capacity = local_5c0.field_2._M_allocated_capacity;
        _Var5._M_p = local_5c0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c0._M_dataplus._M_p == &local_5c0.field_2) goto LAB_003aab64;
      }
      goto LAB_003ab2d0;
    }
    if (bVar1 < 0x6e) {
      if (bVar1 == 0x5b) {
        __return_storage_ptr__->is_ok_ = true;
        (__return_storage_ptr__->field_1).succ_.value = array;
        goto LAB_003aab64;
      }
      if (bVar1 == 0x66) {
LAB_003aab8e:
        __return_storage_ptr__->is_ok_ = true;
        (__return_storage_ptr__->field_1).succ_.value = boolean;
        goto LAB_003aab64;
      }
      if (bVar1 == 0x69) {
        local_828.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005289f8;
        local_828.others_.
        super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x430d6a;
        local_828.others_.
        super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3;
        literal::scan((region *)local_808,(literal *)&local_828,&local_5a0);
        uVar4 = local_808._0_8_;
        region::~region((region *)local_808);
        if ((pointer)uVar4 != (pointer)0x0) goto LAB_003aaf43;
        local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_640,
                   "toml::parse_value: `inf` must be in lowercase. A string must be surrounded by quotes."
                   ,"");
        syntax::floating(&local_828,&ctx->toml_spec_);
        location::location(&local_3c0,&local_5a0);
        local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_660,"");
        make_syntax_error<toml::detail::either>
                  ((error_info *)local_808,&local_640,&local_828,&local_3c0,&local_660);
        err<toml::error_info>(&local_130,(error_info *)local_808);
        __return_storage_ptr__->is_ok_ = false;
        failure<toml::error_info>::failure
                  ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_130)
        ;
        failure<toml::error_info>::~failure(&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7d0._M_p != local_7c0) {
          operator_delete(local_7d0._M_p,local_7c0[0]._M_allocated_capacity + 1);
        }
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_7e8);
        if ((undefined1 *)local_808._0_8_ != local_808 + 0x10) {
          operator_delete((void *)local_808._0_8_,local_808._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_660._M_dataplus._M_p != &local_660.field_2) {
          operator_delete(local_660._M_dataplus._M_p,local_660.field_2._M_allocated_capacity + 1);
        }
        location::~location(&local_3c0);
        std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
        ~vector(&local_828.others_);
        local_700.field_2._M_allocated_capacity = local_640.field_2._M_allocated_capacity;
        _Var5._M_p = local_640._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_640._M_dataplus._M_p == &local_640.field_2) goto LAB_003aab64;
        goto LAB_003ab2d0;
      }
    }
    else {
      if (bVar1 == 0x6e) {
        if ((ctx->toml_spec_).ext_null_value == true) {
          local_828.super_scanner_base._vptr_scanner_base =
               (_func_int **)&PTR__scanner_base_005289f8;
          local_828.others_.
          super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x42df48;
          local_828.others_.
          super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3;
          literal::scan((region *)local_808,(literal *)&local_828,&local_5a0);
          uVar4 = local_808._0_8_;
          region::~region((region *)local_808);
          if ((pointer)uVar4 != (pointer)0x0) {
LAB_003aaf43:
            __return_storage_ptr__->is_ok_ = true;
            (__return_storage_ptr__->field_1).succ_.value = floating;
            goto LAB_003aab64;
          }
          local_828.super_scanner_base._vptr_scanner_base =
               (_func_int **)&PTR__scanner_base_005289f8;
          local_828.others_.
          super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x40ec59;
          local_828.others_.
          super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4;
          literal::scan((region *)local_808,(literal *)&local_828,&local_5a0);
          region::~region((region *)local_808);
          if ((pointer)local_808._0_8_ != (pointer)0x0) {
            __return_storage_ptr__->is_ok_ = true;
            (__return_storage_ptr__->field_1).succ_.value = empty;
            goto LAB_003aab64;
          }
          local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_6c0,
                     "toml::parse_value: Both `nan` and `null` must be in lowercase. A string must be surrounded by quotes."
                     ,"");
          syntax::floating(&local_828,&ctx->toml_spec_);
          location::location(&local_450,&local_5a0);
          local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e0,"");
          make_syntax_error<toml::detail::either>
                    ((error_info *)local_808,&local_6c0,&local_828,&local_450,&local_6e0);
          err<toml::error_info>(&local_1e0,(error_info *)local_808);
          __return_storage_ptr__->is_ok_ = false;
          failure<toml::error_info>::failure
                    ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                     &local_1e0);
          failure<toml::error_info>::~failure(&local_1e0);
          error_info::~error_info((error_info *)local_808);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
            operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
          }
          location::~location(&local_450);
          std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ::~vector(&local_828.others_);
          local_700.field_2._M_allocated_capacity = local_6c0.field_2._M_allocated_capacity;
          _Var5._M_p = local_6c0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6c0._M_dataplus._M_p == &local_6c0.field_2) goto LAB_003aab64;
        }
        else {
          local_828.super_scanner_base._vptr_scanner_base =
               (_func_int **)&PTR__scanner_base_005289f8;
          local_828.others_.
          super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x42df48;
          local_828.others_.
          super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3;
          literal::scan((region *)local_808,(literal *)&local_828,&local_5a0);
          region::~region((region *)local_808);
          if ((pointer)local_808._0_8_ != (pointer)0x0) goto LAB_003aaf43;
          local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_700,
                     "toml::parse_value: `nan` must be in lowercase. A string must be surrounded by quotes."
                     ,"");
          syntax::floating(&local_828,&ctx->toml_spec_);
          location::location(&local_498,&local_5a0);
          local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_720,"");
          make_syntax_error<toml::detail::either>
                    ((error_info *)local_808,&local_700,&local_828,&local_498,&local_720);
          err<toml::error_info>(&local_238,(error_info *)local_808);
          __return_storage_ptr__->is_ok_ = false;
          failure<toml::error_info>::failure
                    ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                     &local_238);
          failure<toml::error_info>::~failure(&local_238);
          error_info::~error_info((error_info *)local_808);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_720._M_dataplus._M_p != &local_720.field_2) {
            operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
          }
          location::~location(&local_498);
          std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ::~vector(&local_828.others_);
          _Var5._M_p = local_700._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_700._M_dataplus._M_p == &local_700.field_2) goto LAB_003aab64;
        }
LAB_003ab2d0:
        operator_delete(_Var5._M_p,local_700.field_2._M_allocated_capacity + 1);
        goto LAB_003aab64;
      }
      if (bVar1 == 0x74) goto LAB_003aab8e;
      if (bVar1 == 0x7b) {
        __return_storage_ptr__->is_ok_ = true;
        (__return_storage_ptr__->field_1).succ_.value = table;
        goto LAB_003aab64;
      }
    }
  }
LAB_003aab56:
  guess_number_type<toml::type_config>(__return_storage_ptr__,loc,ctx);
LAB_003aab64:
  location::~location(&local_5a0);
  return __return_storage_ptr__;
}

Assistant:

result<value_t, error_info>
guess_value_type(const location& loc, const context<TC>& ctx)
{
    const auto& sp = ctx.toml_spec();
    location inner(loc);

    switch(loc.current())
    {
        case '"' : {return ok(value_t::string);  }
        case '\'': {return ok(value_t::string);  }
        case '[' : {return ok(value_t::array);   }
        case '{' : {return ok(value_t::table);   }
        case 't' :
        {
            return ok(value_t::boolean);
        }
        case 'f' :
        {
            return ok(value_t::boolean);
        }
        case 'T' : // invalid boolean.
        {
            return err(make_syntax_error("toml::parse_value: "
                "`true` must be in lowercase. "
                "A string must be surrounded by quotes.",
                syntax::boolean(sp), inner));
        }
        case 'F' :
        {
            return err(make_syntax_error("toml::parse_value: "
                "`false` must be in lowercase. "
                "A string must be surrounded by quotes.",
                syntax::boolean(sp), inner));
        }
        case 'i' : // inf or string without quotes(syntax error).
        {
            if(literal("inf").scan(inner).is_ok())
            {
                return ok(value_t::floating);
            }
            else
            {
                return err(make_syntax_error("toml::parse_value: "
                    "`inf` must be in lowercase. "
                    "A string must be surrounded by quotes.",
                    syntax::floating(sp), inner));
            }
        }
        case 'I' : // Inf or string without quotes(syntax error).
        {
            return err(make_syntax_error("toml::parse_value: "
                "`inf` must be in lowercase. "
                "A string must be surrounded by quotes.",
                syntax::floating(sp), inner));
        }
        case 'n' : // nan or null-extension
        {
            if(sp.ext_null_value)
            {
                if(literal("nan").scan(inner).is_ok())
                {
                    return ok(value_t::floating);
                }
                else if(literal("null").scan(inner).is_ok())
                {
                    return ok(value_t::empty);
                }
                else
                {
                    return err(make_syntax_error("toml::parse_value: "
                        "Both `nan` and `null` must be in lowercase. "
                        "A string must be surrounded by quotes.",
                        syntax::floating(sp), inner));
                }
            }
            else // must be nan.
            {
                if(literal("nan").scan(inner).is_ok())
                {
                    return ok(value_t::floating);
                }
                else
                {
                    return err(make_syntax_error("toml::parse_value: "
                        "`nan` must be in lowercase. "
                        "A string must be surrounded by quotes.",
                        syntax::floating(sp), inner));
                }
            }
        }
        case 'N' : // nan or null-extension
        {
            if(sp.ext_null_value)
            {
                return err(make_syntax_error("toml::parse_value: "
                    "Both `nan` and `null` must be in lowercase. "
                    "A string must be surrounded by quotes.",
                    syntax::floating(sp), inner));
            }
            else
            {
                return err(make_syntax_error("toml::parse_value: "
                    "`nan` must be in lowercase. "
                    "A string must be surrounded by quotes.",
                    syntax::floating(sp), inner));
            }
        }
        default  :
        {
            return guess_number_type(loc, ctx);
        }
    }
}